

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O3

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::CreateTilePipelineState
          (RenderDeviceBase<Diligent::EngineGLImplTraits> *this,
          TilePipelineStateCreateInfo *PSOCreateInfo,IPipelineState **ppPipelineState)

{
  string msg;
  string local_28;
  
  FormatString<char[96]>
            (&local_28,
             (char (*) [96])
             "Tile pipeline is not supported by this device. Please check DeviceFeatures.TileShaders feature."
            );
  DebugAssertionFailed
            (local_28._M_dataplus._M_p,"CreateTilePipelineState",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
             ,0x12e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

CreateTilePipelineState(const TilePipelineStateCreateInfo& PSOCreateInfo,
                                                            IPipelineState**                   ppPipelineState) override
    {
        UNSUPPORTED("Tile pipeline is not supported by this device. Please check DeviceFeatures.TileShaders feature.");
    }